

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O2

uint32_t __thiscall
FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  bool bVar1;
  long lVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint32_t b;
  uint uVar7;
  long lVar8;
  uint32_t *local_40;
  uint32_t *in_local;
  
  lVar8 = DAT_001aa378;
  b = *(uint32_t *)(DAT_001aa378 + -4);
  in_local = in;
  uVar3 = tryB(this,b,in,len);
  local_40 = in + len;
  uVar4 = maxbits<unsigned_int_const*>(&in_local,&local_40);
  lVar2 = NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  uVar6 = 0xffffffffffffffff;
  do {
    uVar6 = (ulong)((int)uVar6 + 1);
  } while (*(int *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + uVar6 * 4) + 0x1cU < uVar4)
  ;
  lVar8 = lVar8 - NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  while (uVar6 < (lVar8 >> 2) - 1U) {
    uVar4 = *(uint32_t *)(lVar2 + uVar6 * 4);
    uVar5 = tryB(this,uVar4,in,len);
    uVar6 = (ulong)((int)uVar6 + 1);
    uVar7 = uVar3;
    if (uVar5 < uVar3) {
      uVar7 = uVar5;
    }
    bVar1 = uVar5 <= uVar3;
    uVar3 = uVar7;
    if (bVar1) {
      b = uVar4;
    }
  }
  return b;
}

Assistant:

__attribute__((pure)) uint32_t
OPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  uint32_t b =
      NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs.back();
  assert(b == 32);
  uint32_t bsize = tryB(b, in, len);
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (mb >
         28 + NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (;
       i <
       NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs.size() - 1;
       i++) {
    const uint32_t csize =
        tryB(NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i],
             in, len);

    if (csize <= bsize) {
      b = NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i];
      bsize = csize;
    }
  }
  return b;
}